

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::computePrimal(HModel *this)

{
  HVector *this_00;
  double dVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  ulong uVar10;
  ulong uVar11;
  int i;
  long lVar12;
  double dVar13;
  double dVar14;
  
  this_00 = &this->buffer;
  HVector::clear(this_00);
  for (lVar12 = 0; lVar12 < this->numTot; lVar12 = lVar12 + 1) {
    if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar12] != 0) {
      dVar13 = (this->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        HMatrix::collect_aj(&this->matrix,this_00,(int)lVar12,dVar13);
      }
    }
  }
  HFactor::ftran(&this->factor,this_00,1.0);
  piVar3 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->baseValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->buffer).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->baseLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this->baseUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  uVar10 = (ulong)(uint)this->numRow;
  if (this->numRow < 1) {
    uVar10 = uVar11;
  }
  dVar13 = 0.0;
  for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    iVar2 = piVar3[uVar11];
    dVar1 = pdVar5[uVar11];
    dVar14 = pdVar4[uVar11] + dVar1;
    dVar13 = dVar13 + dVar14 * dVar14;
    pdVar4[uVar11] = -dVar1;
    pdVar7[uVar11] = pdVar6[iVar2];
    pdVar9[uVar11] = pdVar8[iVar2];
  }
  if (dVar13 < 0.0) {
    sqrt(dVar13);
  }
  this->mlFg_haveBasicPrimals = 1;
  return;
}

Assistant:

void HModel::computePrimal() {
    buffer.clear();
    for (int i = 0; i < numTot; i++)
        if (nonbasicFlag[i] && workValue[i] != 0)
            matrix.collect_aj(buffer, i, workValue[i]);
    factor.ftran(buffer, 1);

#ifdef JAJH_dev
    int n_rp = 0;
    double rp_tl = 0.0;
    int mx_n_rp = 10;
    double norm_dl_pr = 0.0;
#endif

    for (int i = 0; i < numRow; i++) {
        int iCol = basicIndex[i];
#ifdef JAJH_dev
	double dl_pr = abs(baseValue[i] +buffer.array[i]);
	if (dl_pr > rp_tl && n_rp < mx_n_rp) {
	  rp_tl = dl_pr*10;
	  n_rp += 1;
	  //	  printf("computePrimal():   DlPr_i = %11g for i = %d\n", dl_pr, i);
	}
	norm_dl_pr += dl_pr*dl_pr;
#endif
        baseValue[i] = -buffer.array[i];
        baseLower[i] = workLower[iCol];
        baseUpper[i] = workUpper[iCol];
    }
#ifdef JAJH_dev
    norm_dl_pr = sqrt(norm_dl_pr);
    //    printf("computePrimal(): ||DlPr|| = %11g\n", norm_dl_pr);
#endif
    //Now have a basic primals
    mlFg_haveBasicPrimals = 1;
}